

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O3

void absl::lts_20250127::cord_internal::CordzHandle::Delete(CordzHandle *handle)

{
  if (handle == (CordzHandle *)0x0) {
    __assert_fail("handle",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cordz_handle.cc"
                  ,0x66,"static void absl::cord_internal::CordzHandle::Delete(CordzHandle *)");
  }
  anon_unknown_0::GlobalQueue();
  if (handle->is_snapshot_ == false) {
    anon_unknown_0::GlobalQueue();
    if (anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_ != 0) {
      Mutex::Lock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
      if (anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_ != 0) {
        handle->dq_prev_ =
             (CordzHandle *)anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_;
        *(CordzHandle **)(anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_ + 0x18) =
             handle;
        anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_ = handle;
        Mutex::Unlock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
        return;
      }
      Mutex::Unlock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
    }
  }
  (*handle->_vptr_CordzHandle[1])(handle);
  return;
}

Assistant:

void CordzHandle::Delete(CordzHandle* handle) {
  assert(handle);
  if (handle) {
    Queue& queue = GlobalQueue();
    if (!handle->SafeToDelete()) {
      MutexLock lock(&queue.mutex);
      CordzHandle* dq_tail = queue.dq_tail.load(std::memory_order_acquire);
      if (dq_tail != nullptr) {
        handle->dq_prev_ = dq_tail;
        dq_tail->dq_next_ = handle;
        queue.dq_tail.store(handle, std::memory_order_release);
        return;
      }
    }
    delete handle;
  }
}